

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetch.hpp
# Opt level: O0

pair<boost::unit_test::basic_cstring<const_char>,_bool> *
boost::runtime::env::env_detail::sys_read_var(cstring *var_name)

{
  iterator __name;
  basic_cstring<const_char> *in_RSI;
  pair<boost::unit_test::basic_cstring<const_char>,_bool> *in_RDI;
  char *res;
  pair<boost::unit_test::basic_cstring<const_char>,_bool> *__x;
  pointer in_stack_ffffffffffffffd8;
  basic_cstring<const_char> *in_stack_ffffffffffffffe0;
  
  __x = in_RDI;
  __name = unit_test::basic_cstring<const_char>::begin(in_RSI);
  getenv(__name);
  unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::make_pair<boost::unit_test::basic_cstring<char_const>,bool>(&__x->first,(bool *)in_RDI);
  return __x;
}

Assistant:

inline std::pair<cstring,bool>
sys_read_var( cstring var_name )
{
    using namespace std;
    char const* res = getenv( var_name.begin() );

    return std::make_pair( cstring(res), res != NULL );
}